

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall
ScriptOperator_operator_6_Test::ScriptOperator_operator_6_Test(ScriptOperator_operator_6_Test *this)

{
  ScriptOperator_operator_6_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ScriptOperator_operator_6_Test_0066e1a8;
  return;
}

Assistant:

TEST(ScriptOperator, operator_6) {
  ScriptOperator script_op(ScriptOperator::OP_3);
  EXPECT_FALSE(script_op > ScriptOperator::OP_RIGHT);
  EXPECT_FALSE(script_op > ScriptOperator::OP_10);
  EXPECT_FALSE(script_op > ScriptOperator::OP_3);
  EXPECT_TRUE(script_op > ScriptOperator::OP_0);
  EXPECT_TRUE(script_op > ScriptOperator::OP_1NEGATE);
  EXPECT_STREQ(script_op.ToString().c_str(), "3");
  EXPECT_STREQ(script_op.ToCodeString().c_str(), "OP_3");
  EXPECT_TRUE(script_op.IsPushOperator());
}